

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

StatusCode __thiscall HttpConn::parseRequest(HttpConn *this)

{
  pointer pcVar1;
  bool bVar2;
  int end_idx;
  StatusCode SVar3;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  bool bVar5;
  
  bVar5 = true;
  do {
    switch(this->parseState_) {
    case CheckRequestLine:
      pcVar1 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var4 = std::
              __search<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (pcVar1 + this->checked_idx_,pcVar1 + this->read_idx_,"\r\n","");
      end_idx = (int)_Var4._M_current - (int)pcVar1;
      bVar2 = true;
      if (end_idx == -1 ||
          _Var4._M_current ==
          (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar5 = false;
      }
      else {
        SVar3 = parseRequesetLine(this,end_idx);
        if (SVar3 == BadRequest) {
          bVar2 = false;
          std::__cxx11::string::_M_replace
                    ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121ad2);
        }
        else if (SVar3 == OK) {
          this->parseState_ = CheckHeaders;
        }
      }
      if (!bVar2) {
        return BadRequest;
      }
      break;
    case CheckHeaders:
      SVar3 = parseHeader(this);
      if (SVar3 != OK) goto switchD_00117e7f_caseD_3;
      this->parseState_ = CheckBody;
      break;
    case CheckBody:
      SVar3 = parseBody(this);
      if (SVar3 != Wait) {
        if (SVar3 == OK) {
          this->parseState_ = Finished;
          SVar3 = processRequest(this);
          return SVar3;
        }
        goto switchD_00117e7f_caseD_3;
      }
      break;
    case Finished:
switchD_00117e7f_caseD_3:
      bVar5 = false;
    }
    if (!bVar5) {
      return Wait;
    }
  } while( true );
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequest() {
    StatusCode code;
    bool hasMore = true;
    while (hasMore) {
    
        switch (parseState_) {
        case CheckRequestLine: 
        {
            int idx = findCRLF(checked_idx_);
            if (idx != -1) {
                code = parseRequesetLine(idx);
                if (code == OK){ 
                    parseState_ = CheckHeaders; 
                }
                else if (code == BadRequest) { 
                    body_ = "Error Request Line!";
                    return BadRequest; 
                }
            } else {
                hasMore = false;
            }
            break;
        }
        case CheckHeaders:
        {
            code = parseHeader();
            if (code == OK) {
                parseState_ = CheckBody;
            } else if (code == BadRequest) {
                body_  = "Error Header!";
                return BadRequest;
            }
            else hasMore = false;
            break;
        }
        case CheckBody:
        {
            code = parseBody();
            if (code == OK) {
                parseState_ = Finished;
                return processRequest();
            } 
            if (code != Wait)
                hasMore = false;
            break;
        }
        case Finished: hasMore = false; break;

    }

    }
    return Wait;
}